

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

int run_test_fs_event_watch_dir(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  uv_loop_t *puVar2;
  int iVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  char *pcVar4;
  uint uVar5;
  uv_fs_t *req;
  long *plVar6;
  uv_fs_event_t *puVar7;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_460 [32];
  uv_fs_t uStack_440;
  uv_loop_t *puStack_280;
  long lStack_268;
  char *pcStack_260;
  uv_fs_t uStack_210;
  undefined8 uStack_48;
  long lStack_40;
  uv_loop_t *puStack_38;
  long local_10;
  
  puVar2 = uv_default_loop();
  fs_event_unlink_files((uv_timer_t *)0x0);
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  iVar1 = uv_fs_event_init(puVar2,&fs_event);
  local_10 = (long)iVar1;
  if (local_10 == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_dir_multi_file,"watch_dir",0);
    local_10 = (long)iVar1;
    if (local_10 != 0) goto LAB_00184063;
    iVar1 = uv_timer_init(puVar2,&timer);
    local_10 = (long)iVar1;
    if (local_10 != 0) goto LAB_00184070;
    iVar1 = uv_timer_start(&timer,fs_event_create_files,100,0);
    local_10 = (long)iVar1;
    if (local_10 != 0) goto LAB_0018407d;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_10 = (long)fs_event_cb_called;
    if (local_10 != (long)fs_event_removed + (long)fs_event_created) goto LAB_0018408a;
    local_10 = 2;
    if (close_cb_called != 2) goto LAB_00184097;
    fs_event_unlink_files((uv_timer_t *)0x0);
    remove("watch_dir/file2");
    remove("watch_dir/file1");
    remove("watch_dir/");
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_10 = 0;
    iVar1 = uv_loop_close(puVar2);
    if (local_10 == iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_event_watch_dir_cold_1();
LAB_00184063:
    run_test_fs_event_watch_dir_cold_2();
LAB_00184070:
    run_test_fs_event_watch_dir_cold_3();
LAB_0018407d:
    run_test_fs_event_watch_dir_cold_4();
LAB_0018408a:
    run_test_fs_event_watch_dir_cold_5();
LAB_00184097:
    run_test_fs_event_watch_dir_cold_6();
  }
  plVar6 = &local_10;
  run_test_fs_event_watch_dir_cold_7();
  puStack_38 = puVar2;
  if (plVar6 == (long *)0x0) {
LAB_00184192:
    uVar5 = 0;
    do {
      uStack_210.bufsml[3].len = 0x1841c1;
      snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-",(ulong)uVar5);
      uStack_210.bufsml[3].len = 0x1841c9;
      iVar1 = remove(fs_event_filename);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x10);
    return iVar1;
  }
  lStack_40 = (long)fs_event_removed;
  uStack_48 = 0x10;
  if (lStack_40 < 0x10) {
    uStack_210.bufsml[3].len = 0x18410d;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    uStack_210.bufsml[3].len = 0x184115;
    iVar1 = remove(fs_event_filename);
    lStack_40 = (long)iVar1;
    uStack_48 = 0;
    if (lStack_40 == 0) {
      if (0xe < fs_event_removed) {
        iVar1 = fs_event_removed;
        fs_event_removed = fs_event_removed + 1;
        return iVar1;
      }
      uStack_210.bufsml[3].len = 0x184167;
      fs_event_removed = fs_event_removed + 1;
      iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
      lStack_40 = (long)iVar1;
      uStack_48 = 0;
      if (lStack_40 == 0) {
        return iVar1;
      }
      uStack_210.bufsml[3].len = 0x184192;
      fs_event_unlink_files_cold_3();
      goto LAB_00184192;
    }
  }
  else {
    uStack_210.bufsml[3].len = 0x1841ea;
    fs_event_unlink_files_cold_1();
  }
  plVar6 = &lStack_40;
  uStack_210.bufsml[3].len = (size_t)create_dir;
  fs_event_unlink_files_cold_2();
  req = &uStack_210;
  puVar7 = (uv_fs_event_t *)0x0;
  iVar3 = 0x1ed;
  iVar1 = uv_fs_mkdir((uv_loop_t *)0x0,req,(char *)plVar6,0x1ed,(uv_fs_cb)0x0);
  if ((iVar1 == -0x11) || (iVar1 == 0)) {
    uv_fs_req_cleanup(&uStack_210);
    return extraout_EAX;
  }
  create_dir_cold_1();
  uVar5 = fs_event_cb_called + 1;
  pcVar4 = (char *)(ulong)uVar5;
  fs_event_cb_called = uVar5;
  if (puVar7 == &fs_event) {
    if (iVar3 != 0) goto LAB_00184345;
    if (1 < extraout_EDX - 1U) goto LAB_00184352;
    iVar1 = strncmp((char *)req,"fsevent-",8);
    if (iVar1 == 0) {
      iVar1 = fs_event_removed + fs_event_created;
      if (iVar1 == 0x10) {
        iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
        if (iVar1 == 0) {
          return 0;
        }
        fs_event_cb_dir_multi_file_cold_5();
        iVar1 = extraout_EAX_00;
      }
      if (uVar5 != 0x20) {
        return iVar1;
      }
      uv_close((uv_handle_t *)&timer,close_cb);
      uv_close((uv_handle_t *)&fs_event,close_cb);
      return extraout_EAX_01;
    }
  }
  else {
    fs_event_cb_dir_multi_file_cold_1();
LAB_00184345:
    fs_event_cb_dir_multi_file_cold_2();
LAB_00184352:
    fs_event_cb_dir_multi_file_cold_3();
  }
  fs_event_cb_dir_multi_file_cold_4();
  if (fs_event_created < 0x10) {
    pcVar4 = fs_event_filename;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    create_file(fs_event_filename);
    iVar1 = fs_event_created;
    if (0xe < fs_event_created) {
      fs_event_created = fs_event_created + 1;
      return iVar1;
    }
    fs_event_created = fs_event_created + 1;
    iVar1 = uv_timer_start(&timer,fs_event_create_files,100,0);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    fs_event_create_files_cold_1();
  }
  fs_event_create_files_cold_2();
  pcStack_260 = pcVar4;
  puVar2 = uv_default_loop();
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");
  create_file("watch_dir/file2");
  iVar1 = uv_fs_event_init(puVar2,&fs_event);
  lStack_268 = (long)iVar1;
  if (lStack_268 == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    lStack_268 = (long)iVar1;
    if (lStack_268 != 0) goto LAB_00184634;
    iVar1 = uv_timer_init(puVar2,&timer);
    lStack_268 = (long)iVar1;
    if (lStack_268 != 0) goto LAB_00184641;
    iVar1 = uv_timer_start(&timer,timer_cb_file,100,100);
    lStack_268 = (long)iVar1;
    if (lStack_268 != 0) goto LAB_0018464e;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_268 = 1;
    if (fs_event_cb_called != 1) goto LAB_0018465b;
    lStack_268 = 2;
    if (timer_cb_called != 2) goto LAB_00184668;
    lStack_268 = 2;
    if (close_cb_called != 2) goto LAB_00184675;
    remove("watch_dir/file2");
    remove("watch_dir/file1");
    remove("watch_dir/");
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_268 = 0;
    iVar1 = uv_loop_close(puVar2);
    if (lStack_268 == iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_event_watch_file_cold_1();
LAB_00184634:
    run_test_fs_event_watch_file_cold_2();
LAB_00184641:
    run_test_fs_event_watch_file_cold_3();
LAB_0018464e:
    run_test_fs_event_watch_file_cold_4();
LAB_0018465b:
    run_test_fs_event_watch_file_cold_5();
LAB_00184668:
    run_test_fs_event_watch_file_cold_6();
LAB_00184675:
    run_test_fs_event_watch_file_cold_7();
  }
  plVar6 = &lStack_268;
  run_test_fs_event_watch_file_cold_8();
  iVar3 = 0x41;
  auStack_460._0_8_ = (void *)0x1846b5;
  puStack_280 = puVar2;
  iVar1 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)(auStack_460 + 0x20),(char *)plVar6,0x41,0x180,
                     (uv_fs_cb)0x0);
  auStack_460._24_8_ = SEXT48(iVar1);
  auStack_460._16_8_ = 0;
  if ((uv_close_cb)auStack_460._24_8_ == (uv_close_cb)0x0) {
    auStack_460._0_8_ = (void *)0x1846e1;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_460 + 0x20));
    iVar3 = 0;
    auStack_460._0_8_ = (void *)0x1846ef;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)(auStack_460 + 0x20),
                        (uv_os_fd_t)uStack_440.result,(uv_fs_cb)0x0);
    auStack_460._24_8_ = SEXT48(iVar1);
    auStack_460._16_8_ = 0;
    if ((uv_close_cb)auStack_460._24_8_ == (uv_close_cb)0x0) {
      auStack_460._0_8_ = (void *)0x184715;
      uv_fs_req_cleanup((uv_fs_t *)(auStack_460 + 0x20));
      return extraout_EAX_02;
    }
  }
  else {
    auStack_460._0_8_ = (void *)0x18472e;
    create_file_cold_1();
  }
  puVar7 = (uv_fs_event_t *)(auStack_460 + 0x18);
  pcVar4 = auStack_460 + 0x10;
  auStack_460._0_8_ = fs_event_cb_file;
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar7 == &fs_event) {
    auStack_460._0_8_ = SEXT48(iVar3);
    if ((code *)auStack_460._0_8_ != (code *)0x0) goto LAB_0018480b;
    auStack_460._0_8_ = SEXT48(extraout_EDX_00);
    if ((code *)auStack_460._0_8_ != (code *)0x2) goto LAB_0018481a;
    iVar1 = strcmp(pcVar4,"file2");
    auStack_460._0_8_ = SEXT48(iVar1);
    if ((code *)auStack_460._0_8_ == (code *)0x0) {
      iVar1 = uv_fs_event_stop(&fs_event);
      auStack_460._0_8_ = SEXT48(iVar1);
      if ((code *)auStack_460._0_8_ == (code *)0x0) {
        uv_close((uv_handle_t *)&fs_event,close_cb);
        return extraout_EAX_03;
      }
      goto LAB_00184838;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_0018480b:
    fs_event_cb_file_cold_2();
LAB_0018481a:
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_00184838:
  handle = (uv_handle_t *)auStack_460;
  fs_event_cb_file_cold_5();
  if (timer_cb_called == 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file1");
    return extraout_EAX_05;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file2");
  uv_close(handle,close_cb);
  return extraout_EAX_04;
}

Assistant:

TEST_IMPL(fs_event_watch_dir) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#elif defined(__MVS__)
  RETURN_SKIP("Directory watching not supported on this platform.");
#elif defined(__APPLE__) && defined(__TSAN__)
  RETURN_SKIP("Times out under TSAN.");
#endif

  uv_loop_t* loop = uv_default_loop();
  int r;

  /* Setup */
  fs_event_unlink_files(NULL);
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event, fs_event_cb_dir_multi_file, "watch_dir", 0);
  ASSERT_OK(r);
  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);
  r = uv_timer_start(&timer, fs_event_create_files, 100, 0);
  ASSERT_OK(r);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(fs_event_cb_called, fs_event_created + fs_event_removed);
  ASSERT_EQ(2, close_cb_called);

  /* Cleanup */
  fs_event_unlink_files(NULL);
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}